

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

string * flatbuffers::anon_unknown_1::ToCamelCase
                   (string *__return_storage_ptr__,string *input,bool is_upper)

{
  ulong uVar1;
  byte bVar2;
  byte *pbVar3;
  ulong uVar4;
  char cVar5;
  ulong uVar6;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar4 = input->_M_string_length;
  if (uVar4 != 0) {
    uVar6 = 0;
    do {
      pbVar3 = (byte *)(input->_M_dataplus)._M_p;
      cVar5 = (char)__return_storage_ptr__;
      if (uVar6 == 0) {
        bVar2 = *pbVar3;
        if (bVar2 == 0x5f) {
          std::__cxx11::string::push_back(cVar5);
          if ((1 < input->_M_string_length) &&
             (bVar2 = (input->_M_dataplus)._M_p[1], ((int)(char)bVar2 & 0xffffffdfU) - 0x41 < 0x1a))
          {
            toupper((uint)bVar2);
            uVar6 = 1;
            std::__cxx11::string::push_back(cVar5);
            goto LAB_0015137e;
          }
        }
        else {
          if (is_upper) {
            toupper((uint)bVar2);
          }
          else {
            tolower((uint)bVar2);
          }
          std::__cxx11::string::push_back(cVar5);
        }
        uVar6 = 0;
      }
      else if ((pbVar3[uVar6] == 0x5f) && (uVar1 = uVar6 + 1, uVar1 < uVar4)) {
        toupper((uint)pbVar3[uVar1]);
        std::__cxx11::string::push_back(cVar5);
        uVar6 = uVar1;
      }
      else {
        std::__cxx11::string::push_back(cVar5);
      }
LAB_0015137e:
      uVar6 = uVar6 + 1;
      uVar4 = input->_M_string_length;
    } while (uVar6 < uVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string ToCamelCase(const std::string &input, bool is_upper) {
  std::string s;
  for (size_t i = 0; i < input.length(); i++) {
    if (!i && input[i] == '_') {
      s += input[i];
      // we ignore leading underscore but make following
      // alphabet char upper.
      if (i + 1 < input.length() && is_alpha(input[i + 1]))
        s += CharToUpper(input[++i]);
    } else if (!i)
      s += is_upper ? CharToUpper(input[i]) : CharToLower(input[i]);
    else if (input[i] == '_' && i + 1 < input.length())
      s += CharToUpper(input[++i]);
    else
      s += input[i];
  }
  return s;
}